

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::VisitComponent(cmComputeLinkDepends *this,uint c)

{
  bool bVar1;
  uint c_00;
  int iVar2;
  reference pvVar3;
  reference this_00;
  reference pvVar4;
  undefined1 local_30 [16];
  const_reverse_iterator ni;
  EdgeList *nl;
  uint c_local;
  cmComputeLinkDepends *this_local;
  
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->ComponentVisited,(ulong)c);
  if (*pvVar3 == '\0') {
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->ComponentVisited,(ulong)c);
    *pvVar3 = '\x01';
    ni.current._M_current =
         (__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
          )cmComputeComponentGraph::GetComponentGraphEdges(this->CCG,c);
    std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::rbegin
              ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)(local_30 + 8));
    while( true ) {
      std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::rend
                ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)local_30);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
                               *)(local_30 + 8),
                              (reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
                               *)local_30);
      if (!bVar1) break;
      this_00 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
                             *)(local_30 + 8));
      c_00 = cmGraphEdge::operator_cast_to_int(this_00);
      VisitComponent(this,c_00);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
                    *)(local_30 + 8));
    }
    iVar2 = this->ComponentOrderId + -1;
    this->ComponentOrderId = iVar2;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->ComponentOrder,(ulong)c);
    *pvVar4 = iVar2;
  }
  return;
}

Assistant:

void cmComputeLinkDepends::VisitComponent(unsigned int c)
{
  // Check if the node has already been visited.
  if(this->ComponentVisited[c])
    {
    return;
    }

  // We are now visiting this component so mark it.
  this->ComponentVisited[c] = 1;

  // Visit the neighbors of the component first.
  // Run in reverse order so the topological order will preserve the
  // original order where there are no constraints.
  EdgeList const& nl = this->CCG->GetComponentGraphEdges(c);
  for(EdgeList::const_reverse_iterator ni = nl.rbegin();
      ni != nl.rend(); ++ni)
    {
    this->VisitComponent(*ni);
    }

  // Assign an ordering id to this component.
  this->ComponentOrder[c] = --this->ComponentOrderId;
}